

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::SubGridIntersectorKPluecker<4,_4,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined8 *puVar5;
  float *pfVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  ushort uVar13;
  ushort uVar14;
  uint uVar15;
  uint uVar16;
  Geometry *pGVar17;
  long lVar18;
  RTCFilterFunctionN p_Var19;
  RTCIntersectArguments *pRVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  byte bVar25;
  byte bVar26;
  byte bVar27;
  byte bVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  byte bVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [12];
  NodeRef *pNVar37;
  uint uVar38;
  int iVar39;
  long lVar40;
  ulong uVar41;
  ulong uVar42;
  uint uVar43;
  uint uVar44;
  long lVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  undefined1 auVar49 [8];
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  undefined4 uVar54;
  ulong unaff_R12;
  size_t mask;
  ulong uVar55;
  long lVar56;
  long lVar57;
  bool bVar58;
  bool bVar59;
  byte bVar60;
  float fVar61;
  byte bVar79;
  byte bVar80;
  byte bVar82;
  float fVar83;
  byte bVar84;
  byte bVar85;
  float fVar86;
  undefined1 auVar62 [16];
  byte bVar81;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar87;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar103;
  float fVar104;
  float fVar110;
  float fVar112;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar111;
  float fVar113;
  float fVar114;
  float fVar115;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar121;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar122;
  float fVar123;
  float fVar132;
  float fVar133;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar134;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar135;
  float fVar136;
  float fVar144;
  float fVar146;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar145;
  float fVar147;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar148;
  float fVar156;
  float fVar157;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar158;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar159;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  undefined1 auVar174 [16];
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar200;
  float fVar201;
  float fVar202;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  undefined1 auVar206 [16];
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  UVIdentity<4> mapUV;
  uint local_c78;
  undefined4 uStack_c74;
  undefined4 uStack_c6c;
  NodeRef *local_c68;
  ulong local_c28;
  undefined1 local_bd8 [16];
  undefined1 local_bc8 [8];
  float fStack_bc0;
  float fStack_bbc;
  float local_bb8;
  float fStack_bb4;
  float fStack_bb0;
  float fStack_bac;
  float local_ba8;
  float fStack_ba4;
  float fStack_ba0;
  float fStack_b9c;
  undefined1 local_b98 [16];
  float local_b88;
  float fStack_b84;
  float fStack_b80;
  float fStack_b7c;
  float local_b78;
  float fStack_b74;
  float fStack_b70;
  float fStack_b6c;
  undefined8 local_b68;
  float fStack_b60;
  float fStack_b5c;
  float local_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  undefined1 (*local_b40) [16];
  RTCFilterFunctionNArguments args;
  PlueckerHitM<4,_embree::sse42::UVIdentity<4>_> hit;
  undefined4 local_908;
  undefined4 uStack_904;
  undefined4 uStack_900;
  undefined4 uStack_8fc;
  undefined1 local_8f8 [16];
  undefined4 local_8e8;
  undefined4 uStack_8e4;
  undefined4 uStack_8e0;
  undefined4 uStack_8dc;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  undefined1 local_8c8 [16];
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  uint local_898;
  uint uStack_894;
  uint uStack_890;
  uint uStack_88c;
  uint local_888;
  uint uStack_884;
  uint uStack_880;
  uint uStack_87c;
  float local_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  undefined8 local_868;
  undefined8 uStack_860;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  undefined8 local_838;
  float fStack_830;
  float fStack_82c;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  undefined8 local_818;
  float fStack_810;
  float fStack_80c;
  undefined8 local_808;
  float fStack_800;
  float fStack_7fc;
  undefined1 local_7f8 [16];
  float local_7e8;
  float fStack_7e4;
  float fStack_7e0;
  float fStack_7dc;
  NodeRef stack [244];
  
  local_c68 = stack + 1;
  stack[0] = root;
  fVar7 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar8 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar9 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar184 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar195 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar203 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar220 = fVar184 * 0.99999964;
  fVar159 = fVar195 * 0.99999964;
  fVar213 = fVar203 * 0.99999964;
  fVar184 = fVar184 * 1.0000004;
  fVar195 = fVar195 * 1.0000004;
  fVar203 = fVar203 * 1.0000004;
  uVar55 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar51 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar52 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar39 = (tray->tnear).field_0.i[k];
  auVar149._4_4_ = iVar39;
  auVar149._0_4_ = iVar39;
  auVar149._8_4_ = iVar39;
  auVar149._12_4_ = iVar39;
  iVar39 = (tray->tfar).field_0.i[k];
  auVar124._4_4_ = iVar39;
  auVar124._0_4_ = iVar39;
  auVar124._8_4_ = iVar39;
  auVar124._12_4_ = iVar39;
  local_b40 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  do {
    pNVar37 = local_c68;
    if (local_c68 == stack) break;
    uVar47 = local_c68[-1].ptr;
    local_c68 = local_c68 + -1;
    do {
      if ((uVar47 & 8) == 0) {
        pfVar6 = (float *)(uVar47 + 0x20 + uVar55);
        auVar62._0_4_ = (*pfVar6 - fVar7) * fVar220;
        auVar62._4_4_ = (pfVar6[1] - fVar7) * fVar220;
        auVar62._8_4_ = (pfVar6[2] - fVar7) * fVar220;
        auVar62._12_4_ = (pfVar6[3] - fVar7) * fVar220;
        pfVar6 = (float *)(uVar47 + 0x20 + uVar51);
        auVar105._0_4_ = (*pfVar6 - fVar8) * fVar159;
        auVar105._4_4_ = (pfVar6[1] - fVar8) * fVar159;
        auVar105._8_4_ = (pfVar6[2] - fVar8) * fVar159;
        auVar105._12_4_ = (pfVar6[3] - fVar8) * fVar159;
        auVar62 = maxps(auVar62,auVar105);
        pfVar6 = (float *)(uVar47 + 0x20 + uVar52);
        auVar119._0_4_ = (*pfVar6 - fVar9) * fVar213;
        auVar119._4_4_ = (pfVar6[1] - fVar9) * fVar213;
        auVar119._8_4_ = (pfVar6[2] - fVar9) * fVar213;
        auVar119._12_4_ = (pfVar6[3] - fVar9) * fVar213;
        pfVar6 = (float *)(uVar47 + 0x20 + (uVar55 ^ 0x10));
        auVar126._0_4_ = (*pfVar6 - fVar7) * fVar184;
        auVar126._4_4_ = (pfVar6[1] - fVar7) * fVar184;
        auVar126._8_4_ = (pfVar6[2] - fVar7) * fVar184;
        auVar126._12_4_ = (pfVar6[3] - fVar7) * fVar184;
        pfVar6 = (float *)(uVar47 + 0x20 + (uVar51 ^ 0x10));
        auVar138._0_4_ = (*pfVar6 - fVar8) * fVar195;
        auVar138._4_4_ = (pfVar6[1] - fVar8) * fVar195;
        auVar138._8_4_ = (pfVar6[2] - fVar8) * fVar195;
        auVar138._12_4_ = (pfVar6[3] - fVar8) * fVar195;
        auVar105 = minps(auVar126,auVar138);
        pfVar6 = (float *)(uVar47 + 0x20 + (uVar52 ^ 0x10));
        auVar116._0_4_ = (*pfVar6 - fVar9) * fVar203;
        auVar116._4_4_ = (pfVar6[1] - fVar9) * fVar203;
        auVar116._8_4_ = (pfVar6[2] - fVar9) * fVar203;
        auVar116._12_4_ = (pfVar6[3] - fVar9) * fVar203;
        auVar88 = maxps(auVar119,auVar149);
        auVar62 = maxps(auVar62,auVar88);
        auVar88 = minps(auVar116,auVar124);
        auVar105 = minps(auVar105,auVar88);
        auVar88._4_4_ = -(uint)(auVar62._4_4_ <= auVar105._4_4_);
        auVar88._0_4_ = -(uint)(auVar62._0_4_ <= auVar105._0_4_);
        auVar88._8_4_ = -(uint)(auVar62._8_4_ <= auVar105._8_4_);
        auVar88._12_4_ = -(uint)(auVar62._12_4_ <= auVar105._12_4_);
        uVar54 = movmskps((int)unaff_R12,auVar88);
        unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar54);
      }
      if ((uVar47 & 8) == 0) {
        if (unaff_R12 == 0) {
          uVar38 = 4;
        }
        else {
          uVar46 = uVar47 & 0xfffffffffffffff0;
          lVar45 = 0;
          if (unaff_R12 != 0) {
            for (; (unaff_R12 >> lVar45 & 1) == 0; lVar45 = lVar45 + 1) {
            }
          }
          uVar38 = 0;
          uVar47 = *(ulong *)(uVar46 + lVar45 * 8);
          uVar48 = unaff_R12 - 1 & unaff_R12;
          if (uVar48 != 0) {
            local_c68->ptr = uVar47;
            lVar45 = 0;
            if (uVar48 != 0) {
              for (; (uVar48 >> lVar45 & 1) == 0; lVar45 = lVar45 + 1) {
              }
            }
            uVar42 = uVar48 - 1;
            while( true ) {
              local_c68 = local_c68 + 1;
              uVar47 = *(ulong *)(uVar46 + lVar45 * 8);
              uVar42 = uVar42 & uVar48;
              if (uVar42 == 0) break;
              local_c68->ptr = uVar47;
              lVar45 = 0;
              if (uVar42 != 0) {
                for (; (uVar42 >> lVar45 & 1) == 0; lVar45 = lVar45 + 1) {
                }
              }
              uVar48 = uVar42 - 1;
            }
          }
        }
      }
      else {
        uVar38 = 6;
      }
    } while (uVar38 == 0);
    if (uVar38 == 6) {
      uVar46 = (ulong)((uint)uVar47 & 0xf);
      uVar48 = uVar46 - 8;
      bVar58 = uVar46 != 8;
      if (bVar58) {
        uVar47 = uVar47 & 0xfffffffffffffff0;
        uVar46 = 0;
        do {
          lVar40 = uVar46 * 0x58;
          lVar45 = uVar47 + lVar40;
          uVar11 = *(undefined8 *)(uVar47 + 0x20 + lVar40);
          uVar12 = *(undefined8 *)(uVar47 + 0x24 + lVar40);
          bVar21 = (byte)uVar11;
          bVar60 = (byte)uVar12;
          bVar22 = (byte)((ulong)uVar11 >> 8);
          bVar79 = (byte)((ulong)uVar12 >> 8);
          bVar23 = (byte)((ulong)uVar11 >> 0x10);
          bVar80 = (byte)((ulong)uVar12 >> 0x10);
          bVar24 = (byte)((ulong)uVar11 >> 0x18);
          bVar81 = (byte)((ulong)uVar12 >> 0x18);
          bVar25 = (byte)((ulong)uVar11 >> 0x20);
          bVar82 = (byte)((ulong)uVar12 >> 0x20);
          bVar26 = (byte)((ulong)uVar11 >> 0x28);
          bVar84 = (byte)((ulong)uVar12 >> 0x28);
          bVar27 = (byte)((ulong)uVar11 >> 0x30);
          bVar85 = (byte)((ulong)uVar12 >> 0x30);
          bVar34 = (byte)((ulong)uVar12 >> 0x38);
          bVar28 = (byte)((ulong)uVar11 >> 0x38);
          auVar63[0] = -((byte)((bVar21 < bVar60) * bVar21 | (bVar21 >= bVar60) * bVar60) == bVar21)
          ;
          auVar63[1] = -((byte)((bVar22 < bVar79) * bVar22 | (bVar22 >= bVar79) * bVar79) == bVar22)
          ;
          auVar63[2] = -((byte)((bVar23 < bVar80) * bVar23 | (bVar23 >= bVar80) * bVar80) == bVar23)
          ;
          auVar63[3] = -((byte)((bVar24 < bVar81) * bVar24 | (bVar24 >= bVar81) * bVar81) == bVar24)
          ;
          auVar63[4] = -((byte)((bVar25 < bVar82) * bVar25 | (bVar25 >= bVar82) * bVar82) == bVar25)
          ;
          auVar63[5] = -((byte)((bVar26 < bVar84) * bVar26 | (bVar26 >= bVar84) * bVar84) == bVar26)
          ;
          auVar63[6] = -((byte)((bVar27 < bVar85) * bVar27 | (bVar27 >= bVar85) * bVar85) == bVar27)
          ;
          auVar63[7] = -((byte)((bVar28 < bVar34) * bVar28 | (bVar28 >= bVar34) * bVar34) == bVar28)
          ;
          auVar63[8] = 0xff;
          auVar63[9] = 0xff;
          auVar63[10] = 0xff;
          auVar63[0xb] = 0xff;
          auVar63[0xc] = 0xff;
          auVar63[0xd] = 0xff;
          auVar63[0xe] = 0xff;
          auVar63[0xf] = 0xff;
          fVar204 = *(float *)(uVar47 + 0x38 + lVar40);
          fVar123 = *(float *)(uVar47 + 0x3c + lVar40);
          fVar103 = *(float *)(uVar47 + 0x44 + lVar40);
          auVar89._8_8_ = 0;
          auVar89._0_8_ = *(ulong *)((uVar55 >> 2) + 0x20 + lVar45);
          auVar62 = pmovzxbd(auVar89,auVar89);
          auVar106._8_8_ = 0;
          auVar106._0_8_ = *(ulong *)(((uVar55 ^ 0x10) >> 2) + 0x20 + lVar45);
          auVar88 = pmovzxbd(auVar106,auVar106);
          fVar173 = *(float *)(uVar47 + 0x48 + lVar40);
          auVar117._8_8_ = 0;
          auVar117._0_8_ = *(ulong *)((uVar51 >> 2) + 0x20 + lVar45);
          auVar105 = pmovzxbd(auVar117,auVar117);
          auVar118._8_8_ = 0;
          auVar118._0_8_ = *(ulong *)(((uVar51 ^ 0x10) >> 2) + 0x20 + lVar45);
          auVar119 = pmovzxbd(auVar118,auVar118);
          fVar136 = *(float *)(uVar47 + 0x4c + lVar40);
          auVar125._8_8_ = 0;
          auVar125._0_8_ = *(ulong *)((uVar52 >> 2) + 0x20 + lVar45);
          auVar126 = pmovzxbd(auVar125,auVar125);
          auVar137._8_8_ = 0;
          auVar137._0_8_ = *(ulong *)(((uVar52 ^ 0x10) >> 2) + 0x20 + lVar45);
          auVar138 = pmovzxbd(auVar137,auVar137);
          fVar177 = *(float *)(uVar47 + 0x40 + lVar40);
          auVar90._0_4_ = (((float)auVar62._0_4_ * fVar103 + fVar204) - fVar7) * fVar220;
          auVar90._4_4_ = (((float)auVar62._4_4_ * fVar103 + fVar204) - fVar7) * fVar220;
          auVar90._8_4_ = (((float)auVar62._8_4_ * fVar103 + fVar204) - fVar7) * fVar220;
          auVar90._12_4_ = (((float)auVar62._12_4_ * fVar103 + fVar204) - fVar7) * fVar220;
          auVar150._0_4_ = (((float)auVar105._0_4_ * fVar173 + fVar123) - fVar8) * fVar159;
          auVar150._4_4_ = (((float)auVar105._4_4_ * fVar173 + fVar123) - fVar8) * fVar159;
          auVar150._8_4_ = (((float)auVar105._8_4_ * fVar173 + fVar123) - fVar8) * fVar159;
          auVar150._12_4_ = (((float)auVar105._12_4_ * fVar173 + fVar123) - fVar8) * fVar159;
          auVar62 = maxps(auVar90,auVar150);
          auVar107._0_4_ = (((float)auVar88._0_4_ * fVar103 + fVar204) - fVar7) * fVar184;
          auVar107._4_4_ = (((float)auVar88._4_4_ * fVar103 + fVar204) - fVar7) * fVar184;
          auVar107._8_4_ = (((float)auVar88._8_4_ * fVar103 + fVar204) - fVar7) * fVar184;
          auVar107._12_4_ = (((float)auVar88._12_4_ * fVar103 + fVar204) - fVar7) * fVar184;
          auVar120._0_4_ = (((float)auVar119._0_4_ * fVar173 + fVar123) - fVar8) * fVar195;
          auVar120._4_4_ = (((float)auVar119._4_4_ * fVar173 + fVar123) - fVar8) * fVar195;
          auVar120._8_4_ = (((float)auVar119._8_4_ * fVar173 + fVar123) - fVar8) * fVar195;
          auVar120._12_4_ = (((float)auVar119._12_4_ * fVar173 + fVar123) - fVar8) * fVar195;
          auVar88 = minps(auVar107,auVar120);
          auVar127._0_4_ = (((float)auVar126._0_4_ * fVar136 + fVar177) - fVar9) * fVar213;
          auVar127._4_4_ = (((float)auVar126._4_4_ * fVar136 + fVar177) - fVar9) * fVar213;
          auVar127._8_4_ = (((float)auVar126._8_4_ * fVar136 + fVar177) - fVar9) * fVar213;
          auVar127._12_4_ = (((float)auVar126._12_4_ * fVar136 + fVar177) - fVar9) * fVar213;
          auVar105 = maxps(auVar127,auVar149);
          auVar62 = maxps(auVar62,auVar105);
          auVar139._0_4_ = (((float)auVar138._0_4_ * fVar136 + fVar177) - fVar9) * fVar203;
          auVar139._4_4_ = (((float)auVar138._4_4_ * fVar136 + fVar177) - fVar9) * fVar203;
          auVar139._8_4_ = (((float)auVar138._8_4_ * fVar136 + fVar177) - fVar9) * fVar203;
          auVar139._12_4_ = (((float)auVar138._12_4_ * fVar136 + fVar177) - fVar9) * fVar203;
          auVar105 = minps(auVar139,auVar124);
          auVar88 = minps(auVar88,auVar105);
          auVar64._4_4_ = -(uint)(auVar62._4_4_ <= auVar88._4_4_);
          auVar64._0_4_ = -(uint)(auVar62._0_4_ <= auVar88._0_4_);
          auVar64._8_4_ = -(uint)(auVar62._8_4_ <= auVar88._8_4_);
          auVar64._12_4_ = -(uint)(auVar62._12_4_ <= auVar88._12_4_);
          auVar62 = pmovzxbd(auVar63 ^ _DAT_01febe20,auVar63 ^ _DAT_01febe20);
          auVar64 = ~auVar62 & auVar64;
          auVar65._0_4_ = auVar64._0_4_ << 0x1f;
          auVar65._4_4_ = auVar64._4_4_ << 0x1f;
          auVar65._8_4_ = auVar64._8_4_ << 0x1f;
          auVar65._12_4_ = auVar64._12_4_ << 0x1f;
          uVar38 = movmskps((int)lVar40,auVar65);
          if (uVar38 != 0) {
            uVar42 = (ulong)(uVar38 & 0xff);
            do {
              lVar40 = 0;
              if (uVar42 != 0) {
                for (; (uVar42 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
                }
              }
              uVar13 = *(ushort *)(lVar45 + lVar40 * 8);
              uVar14 = *(ushort *)(lVar45 + 2 + lVar40 * 8);
              uVar38 = *(uint *)(lVar45 + 0x50);
              uVar15 = *(uint *)(lVar45 + 4 + lVar40 * 8);
              pGVar17 = (context->scene->geometries).items[uVar38].ptr;
              lVar40 = *(long *)&pGVar17->field_0x58;
              auVar49 = (undefined1  [8])
                        ((ulong)uVar15 *
                        pGVar17[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i
                        );
              lVar18 = *(long *)&pGVar17[1].time_range.upper;
              uVar43 = uVar13 & 0x7fff;
              uVar44 = uVar14 & 0x7fff;
              uVar16 = *(uint *)(lVar40 + 4 + (long)auVar49);
              uVar50 = (ulong)uVar16;
              uVar53 = (ulong)(uVar16 * uVar44 + *(int *)(lVar40 + (long)auVar49) + uVar43);
              p_Var19 = pGVar17[1].intersectionFilterN;
              pfVar6 = (float *)(lVar18 + (long)p_Var19 * uVar53);
              pfVar1 = (float *)(lVar18 + (uVar53 + 1) * (long)p_Var19);
              fVar204 = *pfVar1;
              local_828 = pfVar1[1];
              fVar123 = pfVar1[2];
              pfVar1 = (float *)(lVar18 + (uVar53 + uVar50) * (long)p_Var19);
              fVar103 = *pfVar1;
              fVar173 = pfVar1[1];
              fVar136 = pfVar1[2];
              lVar57 = uVar53 + uVar50 + 1;
              pfVar1 = (float *)(lVar18 + lVar57 * (long)p_Var19);
              local_b58 = *pfVar1;
              fVar177 = pfVar1[1];
              fVar145 = pfVar1[2];
              fStack_b4c = pfVar1[3];
              uVar41 = (ulong)(-1 < (short)uVar13);
              pfVar1 = (float *)(lVar18 + (uVar53 + uVar41 + 1) * (long)p_Var19);
              lVar56 = uVar41 + lVar57;
              pfVar2 = (float *)(lVar18 + lVar56 * (long)p_Var19);
              fStack_844 = pfVar2[1];
              uVar41 = 0;
              if (-1 < (short)uVar14) {
                uVar41 = uVar50;
              }
              pfVar3 = (float *)(lVar18 + (uVar53 + uVar50 + uVar41) * (long)p_Var19);
              fVar183 = pfVar3[1];
              fVar147 = pfVar3[2];
              pfVar4 = (float *)(lVar18 + (lVar57 + uVar41) * (long)p_Var19);
              fVar180 = pfVar4[1];
              fVar146 = pfVar4[2];
              puVar5 = (undefined8 *)(lVar18 + (uVar41 + lVar56) * (long)p_Var19);
              local_868 = *puVar5;
              uStack_860 = puVar5[1];
              local_848 = *pfVar2;
              fStack_840 = pfVar2[2];
              fStack_83c = pfVar2[3];
              local_858 = *pfVar4;
              fStack_854 = fVar180;
              fStack_850 = fVar146;
              fStack_84c = pfVar4[3];
              fVar114 = *(float *)(ray + k * 4);
              fVar221 = *pfVar6 - fVar114;
              fStack_ba4 = fVar204 - fVar114;
              fStack_ba0 = local_b58 - fVar114;
              fStack_b9c = fVar103 - fVar114;
              local_818 = CONCAT44(*pfVar1,fVar204);
              fVar204 = fVar204 - fVar114;
              fVar207 = *pfVar1 - fVar114;
              fVar209 = *pfVar2 - fVar114;
              fVar211 = local_b58 - fVar114;
              local_838 = CONCAT44(local_b58,fVar103);
              fVar103 = fVar103 - fVar114;
              fVar110 = local_b58 - fVar114;
              fVar112 = *pfVar4 - fVar114;
              fVar114 = *pfVar3 - fVar114;
              fVar212 = *(float *)(ray + k * 4 + 0x10);
              fVar196 = pfVar6[1] - fVar212;
              fStack_bb4 = local_828 - fVar212;
              fStack_bb0 = fVar177 - fVar212;
              fStack_bac = fVar173 - fVar212;
              fStack_824 = pfVar1[1];
              fStack_820 = fStack_844;
              fStack_81c = fVar177;
              fVar148 = local_828 - fVar212;
              fVar156 = pfVar1[1] - fVar212;
              fVar157 = fStack_844 - fVar212;
              fVar158 = fVar177 - fVar212;
              fVar205 = fVar173 - fVar212;
              fVar208 = fVar177 - fVar212;
              fVar210 = fVar180 - fVar212;
              fVar212 = fVar183 - fVar212;
              fVar115 = *(float *)(ray + k * 4 + 0x20);
              fVar214 = pfVar6[2] - fVar115;
              fVar216 = fVar123 - fVar115;
              fStack_b60 = fVar145 - fVar115;
              fStack_b5c = fVar136 - fVar115;
              local_808 = CONCAT44(pfVar1[2],fVar123);
              fVar123 = fVar123 - fVar115;
              fVar132 = pfVar1[2] - fVar115;
              fVar133 = pfVar2[2] - fVar115;
              fVar134 = fVar145 - fVar115;
              fVar104 = fVar136 - fVar115;
              fVar111 = fVar145 - fVar115;
              fVar113 = fVar146 - fVar115;
              fVar115 = fVar147 - fVar115;
              fVar167 = fVar103 - fVar221;
              fVar168 = fVar110 - fStack_ba4;
              fVar169 = fVar112 - fStack_ba0;
              fVar170 = fVar114 - fStack_b9c;
              fVar185 = fVar205 - fVar196;
              fVar189 = fVar208 - fStack_bb4;
              fVar191 = fVar210 - fStack_bb0;
              fVar193 = fVar212 - fStack_bac;
              fVar171 = fVar104 - fVar214;
              fVar175 = fVar111 - fVar216;
              fVar178 = fVar113 - fStack_b60;
              fVar181 = fVar115 - fStack_b5c;
              fVar121 = *(float *)(ray + k * 4 + 0x50);
              local_bc8._4_4_ = *(undefined4 *)(ray + k * 4 + 0x60);
              fVar122 = *(float *)(ray + k * 4 + 0x40);
              fVar135 = (fVar185 * (fVar104 + fVar214) - (fVar205 + fVar196) * fVar171) * fVar122 +
                        ((fVar103 + fVar221) * fVar171 - (fVar104 + fVar214) * fVar167) * fVar121 +
                        (fVar167 * (fVar205 + fVar196) - (fVar103 + fVar221) * fVar185) *
                        (float)local_bc8._4_4_;
              fVar144 = (fVar189 * (fVar111 + fVar216) - (fVar208 + fStack_bb4) * fVar175) * fVar122
                        + ((fVar110 + fStack_ba4) * fVar175 - (fVar111 + fVar216) * fVar168) *
                          fVar121 + (fVar168 * (fVar208 + fStack_bb4) -
                                    (fVar110 + fStack_ba4) * fVar189) * (float)local_bc8._4_4_;
              local_7f8._0_8_ = CONCAT44(fVar144,fVar135);
              local_7f8._8_4_ =
                   (fVar191 * (fVar113 + fStack_b60) - (fVar210 + fStack_bb0) * fVar178) * fVar122 +
                   ((fVar112 + fStack_ba0) * fVar178 - (fVar113 + fStack_b60) * fVar169) * fVar121 +
                   (fVar169 * (fVar210 + fStack_bb0) - (fVar112 + fStack_ba0) * fVar191) *
                   (float)local_bc8._4_4_;
              local_7f8._12_4_ =
                   (fVar193 * (fVar115 + fStack_b5c) - (fVar212 + fStack_bac) * fVar181) * fVar122 +
                   ((fVar114 + fStack_b9c) * fVar181 - (fVar115 + fStack_b5c) * fVar170) * fVar121 +
                   (fVar170 * (fVar212 + fStack_bac) - (fVar114 + fStack_b9c) * fVar193) *
                   (float)local_bc8._4_4_;
              fVar172 = fVar221 - fVar204;
              fVar176 = fStack_ba4 - fVar207;
              fVar179 = fStack_ba0 - fVar209;
              fVar182 = fStack_b9c - fVar211;
              fVar186 = fVar196 - fVar148;
              fVar190 = fStack_bb4 - fVar156;
              fVar192 = fStack_bb0 - fVar157;
              fVar194 = fStack_bac - fVar158;
              fVar61 = fVar214 - fVar123;
              fVar83 = fVar216 - fVar132;
              fVar86 = fStack_b60 - fVar133;
              fVar87 = fStack_b5c - fVar134;
              local_7e8 = (fVar186 * (fVar214 + fVar123) - (fVar196 + fVar148) * fVar61) * fVar122 +
                          ((fVar221 + fVar204) * fVar61 - (fVar214 + fVar123) * fVar172) * fVar121 +
                          (fVar172 * (fVar196 + fVar148) - (fVar221 + fVar204) * fVar186) *
                          (float)local_bc8._4_4_;
              fStack_7e4 = (fVar190 * (fVar216 + fVar132) - (fStack_bb4 + fVar156) * fVar83) *
                           fVar122 + ((fStack_ba4 + fVar207) * fVar83 -
                                     (fVar216 + fVar132) * fVar176) * fVar121 +
                                     (fVar176 * (fStack_bb4 + fVar156) -
                                     (fStack_ba4 + fVar207) * fVar190) * (float)local_bc8._4_4_;
              fStack_7e0 = (fVar192 * (fStack_b60 + fVar133) - (fStack_bb0 + fVar157) * fVar86) *
                           fVar122 + ((fStack_ba0 + fVar209) * fVar86 -
                                     (fStack_b60 + fVar133) * fVar179) * fVar121 +
                                     (fVar179 * (fStack_bb0 + fVar157) -
                                     (fStack_ba0 + fVar209) * fVar192) * (float)local_bc8._4_4_;
              fStack_7dc = (fVar194 * (fStack_b5c + fVar134) - (fStack_bac + fVar158) * fVar87) *
                           fVar122 + ((fStack_b9c + fVar211) * fVar87 -
                                     (fStack_b5c + fVar134) * fVar182) * fVar121 +
                                     (fVar182 * (fStack_bac + fVar158) -
                                     (fStack_b9c + fVar211) * fVar194) * (float)local_bc8._4_4_;
              fVar197 = fVar204 - fVar103;
              fVar200 = fVar207 - fVar110;
              fVar201 = fVar209 - fVar112;
              fVar202 = fVar211 - fVar114;
              fVar163 = fVar148 - fVar205;
              fVar164 = fVar156 - fVar208;
              fVar165 = fVar157 - fVar210;
              fVar166 = fVar158 - fVar212;
              fVar215 = fVar123 - fVar104;
              fVar217 = fVar132 - fVar111;
              fVar218 = fVar133 - fVar113;
              fVar219 = fVar134 - fVar115;
              local_bc8._0_4_ = local_bc8._4_4_;
              fStack_bc0 = (float)local_bc8._4_4_;
              fStack_bbc = (float)local_bc8._4_4_;
              auVar128._0_4_ =
                   (fVar163 * (fVar104 + fVar123) - (fVar205 + fVar148) * fVar215) * fVar122 +
                   ((fVar103 + fVar204) * fVar215 - (fVar104 + fVar123) * fVar197) * fVar121 +
                   (fVar197 * (fVar205 + fVar148) - (fVar103 + fVar204) * fVar163) *
                   (float)local_bc8._4_4_;
              auVar128._4_4_ =
                   (fVar164 * (fVar111 + fVar132) - (fVar208 + fVar156) * fVar217) * fVar122 +
                   ((fVar110 + fVar207) * fVar217 - (fVar111 + fVar132) * fVar200) * fVar121 +
                   (fVar200 * (fVar208 + fVar156) - (fVar110 + fVar207) * fVar164) *
                   (float)local_bc8._4_4_;
              auVar128._8_4_ =
                   (fVar165 * (fVar113 + fVar133) - (fVar210 + fVar157) * fVar218) * fVar122 +
                   ((fVar112 + fVar209) * fVar218 - (fVar113 + fVar133) * fVar201) * fVar121 +
                   (fVar201 * (fVar210 + fVar157) - (fVar112 + fVar209) * fVar165) *
                   (float)local_bc8._4_4_;
              auVar128._12_4_ =
                   (fVar166 * (fVar115 + fVar134) - (fVar212 + fVar158) * fVar219) * fVar122 +
                   ((fVar114 + fVar211) * fVar219 - (fVar115 + fVar134) * fVar202) * fVar121 +
                   (fVar202 * (fVar212 + fVar158) - (fVar114 + fVar211) * fVar166) *
                   (float)local_bc8._4_4_;
              hit.UVW.field_0.v[0] = fVar135 + local_7e8 + auVar128._0_4_;
              hit.UVW.field_0.v[1] = fVar144 + fStack_7e4 + auVar128._4_4_;
              hit.UVW.field_0.v[2] = local_7f8._8_4_ + fStack_7e0 + auVar128._8_4_;
              hit.UVW.field_0.v[3] = local_7f8._12_4_ + fStack_7dc + auVar128._12_4_;
              auVar66._8_4_ = local_7f8._8_4_;
              auVar66._0_8_ = local_7f8._0_8_;
              auVar66._12_4_ = local_7f8._12_4_;
              auVar29._4_4_ = fStack_7e4;
              auVar29._0_4_ = local_7e8;
              auVar29._8_4_ = fStack_7e0;
              auVar29._12_4_ = fStack_7dc;
              auVar62 = minps(auVar66,auVar29);
              auVar62 = minps(auVar62,auVar128);
              auVar151._8_4_ = local_7f8._8_4_;
              auVar151._0_8_ = local_7f8._0_8_;
              auVar151._12_4_ = local_7f8._12_4_;
              auVar30._4_4_ = fStack_7e4;
              auVar30._0_4_ = local_7e8;
              auVar30._8_4_ = fStack_7e0;
              auVar30._12_4_ = fStack_7dc;
              auVar88 = maxps(auVar151,auVar30);
              auVar88 = maxps(auVar88,auVar128);
              local_878 = ABS(hit.UVW.field_0.v[0]);
              fStack_874 = ABS(hit.UVW.field_0.v[1]);
              fStack_870 = ABS(hit.UVW.field_0.v[2]);
              fStack_86c = ABS(hit.UVW.field_0.v[3]);
              auVar152._4_4_ = -(uint)(auVar88._4_4_ <= fStack_874 * 1.1920929e-07);
              auVar152._0_4_ = -(uint)(auVar88._0_4_ <= local_878 * 1.1920929e-07);
              auVar152._8_4_ = -(uint)(auVar88._8_4_ <= fStack_870 * 1.1920929e-07);
              auVar152._12_4_ = -(uint)(auVar88._12_4_ <= fStack_86c * 1.1920929e-07);
              auVar67._4_4_ = -(uint)(-(fStack_874 * 1.1920929e-07) <= auVar62._4_4_);
              auVar67._0_4_ = -(uint)(-(local_878 * 1.1920929e-07) <= auVar62._0_4_);
              auVar67._8_4_ = -(uint)(-(fStack_870 * 1.1920929e-07) <= auVar62._8_4_);
              auVar67._12_4_ = -(uint)(-(fStack_86c * 1.1920929e-07) <= auVar62._12_4_);
              auVar152 = auVar152 | auVar67;
              iVar39 = movmskps((int)&mapUV,auVar152);
              uVar54 = (undefined4)k;
              fStack_b54 = fVar177;
              fStack_b50 = fVar145;
              if (iVar39 != 0) {
                auVar187._0_4_ = fVar186 * fVar215 - fVar163 * fVar61;
                auVar187._4_4_ = fVar190 * fVar217 - fVar164 * fVar83;
                auVar187._8_4_ = fVar192 * fVar218 - fVar165 * fVar86;
                auVar187._12_4_ = fVar194 * fVar219 - fVar166 * fVar87;
                auVar68._4_4_ = -(uint)(ABS(fVar190 * fVar175) < ABS(fVar164 * fVar83));
                auVar68._0_4_ = -(uint)(ABS(fVar186 * fVar171) < ABS(fVar163 * fVar61));
                auVar68._8_4_ = -(uint)(ABS(fVar192 * fVar178) < ABS(fVar165 * fVar86));
                auVar68._12_4_ = -(uint)(ABS(fVar194 * fVar181) < ABS(fVar166 * fVar87));
                auVar31._4_4_ = fVar189 * fVar83 - fVar190 * fVar175;
                auVar31._0_4_ = fVar185 * fVar61 - fVar186 * fVar171;
                auVar31._8_4_ = fVar191 * fVar86 - fVar192 * fVar178;
                auVar31._12_4_ = fVar193 * fVar87 - fVar194 * fVar181;
                hit.vNg.field_0.field_0.x.field_0 =
                     (vfloat_impl<4>)blendvps(auVar187,auVar31,auVar68);
                auVar140._0_4_ = fVar171 * fVar172 - fVar167 * fVar61;
                auVar140._4_4_ = fVar175 * fVar176 - fVar168 * fVar83;
                auVar140._8_4_ = fVar178 * fVar179 - fVar169 * fVar86;
                auVar140._12_4_ = fVar181 * fVar182 - fVar170 * fVar87;
                auVar198._0_4_ = fVar197 * fVar61 - fVar172 * fVar215;
                auVar198._4_4_ = fVar200 * fVar83 - fVar176 * fVar217;
                auVar198._8_4_ = fVar201 * fVar86 - fVar179 * fVar218;
                auVar198._12_4_ = fVar202 * fVar87 - fVar182 * fVar219;
                auVar69._4_4_ = -(uint)(ABS(fVar168 * fVar83) < ABS(fVar176 * fVar217));
                auVar69._0_4_ = -(uint)(ABS(fVar167 * fVar61) < ABS(fVar172 * fVar215));
                auVar69._8_4_ = -(uint)(ABS(fVar169 * fVar86) < ABS(fVar179 * fVar218));
                auVar69._12_4_ = -(uint)(ABS(fVar170 * fVar87) < ABS(fVar182 * fVar219));
                hit.vNg.field_0.field_0.y.field_0 =
                     (vfloat_impl<4>)blendvps(auVar198,auVar140,auVar69);
                auVar174._0_4_ = fVar172 * fVar163 - fVar197 * fVar186;
                auVar174._4_4_ = fVar176 * fVar164 - fVar200 * fVar190;
                auVar174._8_4_ = fVar179 * fVar165 - fVar201 * fVar192;
                auVar174._12_4_ = fVar182 * fVar166 - fVar202 * fVar194;
                auVar70._4_4_ = -(uint)(ABS(fVar176 * fVar189) < ABS(fVar200 * fVar190));
                auVar70._0_4_ = -(uint)(ABS(fVar172 * fVar185) < ABS(fVar197 * fVar186));
                auVar70._8_4_ = -(uint)(ABS(fVar179 * fVar191) < ABS(fVar201 * fVar192));
                auVar70._12_4_ = -(uint)(ABS(fVar182 * fVar193) < ABS(fVar202 * fVar194));
                auVar33._4_4_ = fVar168 * fVar190 - fVar176 * fVar189;
                auVar33._0_4_ = fVar167 * fVar186 - fVar172 * fVar185;
                auVar33._8_4_ = fVar169 * fVar192 - fVar179 * fVar191;
                auVar33._12_4_ = fVar170 * fVar194 - fVar182 * fVar193;
                hit.vNg.field_0.field_0.z.field_0 =
                     (vfloat_impl<4>)blendvps(auVar174,auVar33,auVar70);
                fVar204 = fVar122 * hit.vNg.field_0._0_4_ +
                          fVar121 * hit.vNg.field_0._16_4_ +
                          (float)local_bc8._4_4_ * hit.vNg.field_0._32_4_;
                fVar123 = fVar122 * hit.vNg.field_0._4_4_ +
                          fVar121 * hit.vNg.field_0._20_4_ +
                          (float)local_bc8._4_4_ * hit.vNg.field_0._36_4_;
                fVar103 = fVar122 * hit.vNg.field_0._8_4_ +
                          fVar121 * hit.vNg.field_0._24_4_ +
                          (float)local_bc8._4_4_ * hit.vNg.field_0._40_4_;
                fVar114 = fVar122 * hit.vNg.field_0._12_4_ +
                          fVar121 * hit.vNg.field_0._28_4_ +
                          (float)local_bc8._4_4_ * hit.vNg.field_0._44_4_;
                auVar160._0_4_ = fVar204 + fVar204;
                auVar160._4_4_ = fVar123 + fVar123;
                auVar160._8_4_ = fVar103 + fVar103;
                auVar160._12_4_ = fVar114 + fVar114;
                auVar91._0_4_ = fVar196 * hit.vNg.field_0._16_4_ + fVar214 * hit.vNg.field_0._32_4_;
                auVar91._4_4_ =
                     fStack_bb4 * hit.vNg.field_0._20_4_ + fVar216 * hit.vNg.field_0._36_4_;
                auVar91._8_4_ =
                     fStack_bb0 * hit.vNg.field_0._24_4_ + fStack_b60 * hit.vNg.field_0._40_4_;
                auVar91._12_4_ =
                     fStack_bac * hit.vNg.field_0._28_4_ + fStack_b5c * hit.vNg.field_0._44_4_;
                fVar212 = fVar221 * hit.vNg.field_0._0_4_ + auVar91._0_4_;
                fVar115 = fStack_ba4 * hit.vNg.field_0._4_4_ + auVar91._4_4_;
                fVar121 = fStack_ba0 * hit.vNg.field_0._8_4_ + auVar91._8_4_;
                fVar122 = fStack_b9c * hit.vNg.field_0._12_4_ + auVar91._12_4_;
                auVar62 = rcpps(auVar91,auVar160);
                fVar204 = auVar62._0_4_;
                fVar123 = auVar62._4_4_;
                fVar103 = auVar62._8_4_;
                fVar114 = auVar62._12_4_;
                hit.vt.field_0.v[0] =
                     ((1.0 - auVar160._0_4_ * fVar204) * fVar204 + fVar204) * (fVar212 + fVar212);
                hit.vt.field_0.v[1] =
                     ((1.0 - auVar160._4_4_ * fVar123) * fVar123 + fVar123) * (fVar115 + fVar115);
                hit.vt.field_0.v[2] =
                     ((1.0 - auVar160._8_4_ * fVar103) * fVar103 + fVar103) * (fVar121 + fVar121);
                hit.vt.field_0.v[3] =
                     ((1.0 - auVar160._12_4_ * fVar114) * fVar114 + fVar114) * (fVar122 + fVar122);
                fVar204 = *(float *)(ray + k * 4 + 0x80);
                fVar123 = *(float *)(ray + k * 4 + 0x30);
                auVar92._0_4_ =
                     -(uint)(hit.vt.field_0.v[0] <= fVar204 && fVar123 <= hit.vt.field_0.v[0]) &
                     auVar152._0_4_;
                auVar92._4_4_ =
                     -(uint)(hit.vt.field_0.v[1] <= fVar204 && fVar123 <= hit.vt.field_0.v[1]) &
                     auVar152._4_4_;
                auVar92._8_4_ =
                     -(uint)(hit.vt.field_0.v[2] <= fVar204 && fVar123 <= hit.vt.field_0.v[2]) &
                     auVar152._8_4_;
                auVar92._12_4_ =
                     -(uint)(hit.vt.field_0.v[3] <= fVar204 && fVar123 <= hit.vt.field_0.v[3]) &
                     auVar152._12_4_;
                iVar39 = movmskps(uVar54,auVar92);
                if (iVar39 != 0) {
                  hit.valid.field_0._0_4_ = auVar92._0_4_ & -(uint)(auVar160._0_4_ != 0.0);
                  hit.valid.field_0._4_4_ = auVar92._4_4_ & -(uint)(auVar160._4_4_ != 0.0);
                  hit.valid.field_0._8_4_ = auVar92._8_4_ & -(uint)(auVar160._8_4_ != 0.0);
                  hit.valid.field_0._12_4_ = auVar92._12_4_ & -(uint)(auVar160._12_4_ != 0.0);
                  iVar39 = movmskps(iVar39,(undefined1  [16])hit.valid.field_0);
                  if (iVar39 != 0) {
                    hit.mapUV = &mapUV;
                    auVar93._4_12_ = hit.valid.field_0._4_12_;
                    auVar93._0_4_ = (float)(int)(*(ushort *)(lVar40 + 8 + (long)auVar49) - 1);
                    auVar129._4_4_ = hit.valid.field_0._4_4_;
                    auVar129._0_4_ = auVar93._0_4_;
                    auVar129._8_4_ = hit.valid.field_0._8_4_;
                    auVar129._12_4_ = hit.valid.field_0._12_4_;
                    auVar62 = rcpss(auVar129,auVar93);
                    auVar141._4_12_ = auVar140._4_12_;
                    auVar141._0_4_ = (float)(int)(*(ushort *)(lVar40 + 10 + (long)auVar49) - 1);
                    fVar204 = (2.0 - auVar93._0_4_ * auVar62._0_4_) * auVar62._0_4_;
                    auVar130._4_4_ = auVar140._4_4_;
                    auVar130._0_4_ = auVar141._0_4_;
                    auVar130._8_4_ = auVar140._8_4_;
                    auVar130._12_4_ = auVar140._12_4_;
                    auVar62 = rcpss(auVar130,auVar141);
                    fVar123 = (2.0 - auVar141._0_4_ * auVar62._0_4_) * auVar62._0_4_;
                    hit.U.field_0._0_4_ = fVar204 * ((float)uVar43 * hit.UVW.field_0.v[0] + fVar135)
                    ;
                    hit.U.field_0._4_4_ =
                         fVar204 * ((float)(uVar43 + 1) * hit.UVW.field_0.v[1] + fVar144);
                    hit.U.field_0._8_4_ =
                         fVar204 * ((float)(uVar43 + 1) * hit.UVW.field_0.v[2] + local_7f8._8_4_);
                    hit.U.field_0._12_4_ =
                         fVar204 * ((float)uVar43 * hit.UVW.field_0.v[3] + local_7f8._12_4_);
                    auVar108._0_4_ = (float)uVar44 * hit.UVW.field_0.v[0] + local_7e8;
                    auVar108._4_4_ = (float)uVar44 * hit.UVW.field_0.v[1] + fStack_7e4;
                    auVar108._8_4_ = (float)(uVar44 + 1) * hit.UVW.field_0.v[2] + fStack_7e0;
                    auVar108._12_4_ = (float)(uVar44 + 1) * hit.UVW.field_0.v[3] + fStack_7dc;
                    hit.V.field_0._0_4_ = fVar123 * auVar108._0_4_;
                    hit.V.field_0._4_4_ = fVar123 * auVar108._4_4_;
                    hit.V.field_0._8_4_ = fVar123 * auVar108._8_4_;
                    hit.V.field_0._12_4_ = fVar123 * auVar108._12_4_;
                    pGVar17 = (context->scene->geometries).items[uVar38].ptr;
                    if ((pGVar17->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      pRVar20 = context->args;
                      if ((pRVar20->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar17->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_002c20dd;
                      auVar35._4_4_ = hit.UVW.field_0.i[1];
                      auVar35._0_4_ = hit.UVW.field_0.i[0];
                      auVar35._8_4_ = hit.UVW.field_0.i[2];
                      auVar35._12_4_ = hit.UVW.field_0.i[3];
                      auVar62 = rcpps(auVar108,auVar35);
                      fVar204 = auVar62._0_4_;
                      fVar123 = auVar62._4_4_;
                      fVar103 = auVar62._8_4_;
                      fVar114 = auVar62._12_4_;
                      fVar204 = (float)(-(uint)(1e-18 <= local_878) &
                                       (uint)(((float)DAT_01feca10 - hit.UVW.field_0.v[0] * fVar204)
                                              * fVar204 + fVar204));
                      fVar123 = (float)(-(uint)(1e-18 <= fStack_874) &
                                       (uint)((DAT_01feca10._4_4_ - hit.UVW.field_0.v[1] * fVar123)
                                              * fVar123 + fVar123));
                      fVar103 = (float)(-(uint)(1e-18 <= fStack_870) &
                                       (uint)((DAT_01feca10._8_4_ - hit.UVW.field_0.v[2] * fVar103)
                                              * fVar103 + fVar103));
                      fVar114 = (float)(-(uint)(1e-18 <= fStack_86c) &
                                       (uint)((DAT_01feca10._12_4_ - hit.UVW.field_0.v[3] * fVar114)
                                              * fVar114 + fVar114));
                      auVar71._0_4_ = hit.U.field_0._0_4_ * fVar204;
                      auVar71._4_4_ = hit.U.field_0._4_4_ * fVar123;
                      auVar71._8_4_ = hit.U.field_0._8_4_ * fVar103;
                      auVar71._12_4_ = hit.U.field_0._12_4_ * fVar114;
                      hit.vu.field_0 =
                           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           minps(auVar71,_DAT_01feca10);
                      auVar94._0_4_ = hit.V.field_0._0_4_ * fVar204;
                      auVar94._4_4_ = hit.V.field_0._4_4_ * fVar123;
                      auVar94._8_4_ = hit.V.field_0._8_4_ * fVar103;
                      auVar94._12_4_ = hit.V.field_0._12_4_ * fVar114;
                      hit.vv.field_0 =
                           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           minps(auVar94,_DAT_01feca10);
                      iVar39 = movmskps((int)pRVar20,(undefined1  [16])hit.valid.field_0);
                      local_c28 = CONCAT44((int)((ulong)pRVar20 >> 0x20),iVar39);
                      lVar18 = 0;
                      if (local_c28 != 0) {
                        for (; (local_c28 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
                        }
                      }
                      local_c78 = (uint)lVar18;
                      uStack_c74 = (undefined4)((ulong)lVar18 >> 0x20);
                      local_bb8._1_3_ = (undefined3)((uint)fVar196 >> 8);
                      local_bb8 = (float)CONCAT31(local_bb8._1_3_,iVar39 == 0);
                      if (iVar39 != 0) {
                        local_b98 = *local_b40;
                        local_bc8 = auVar49;
                        local_b88 = (float)uVar15;
                        fStack_b84 = (float)uVar15;
                        fStack_b80 = (float)uVar15;
                        fStack_b7c = (float)uVar15;
                        local_b78 = (float)uVar38;
                        fStack_b74 = (float)uVar38;
                        fStack_b70 = (float)uVar38;
                        fStack_b6c = (float)uVar38;
                        do {
                          local_ba8 = *(float *)(ray + k * 4 + 0x80);
                          lVar18 = CONCAT44(uStack_c74,local_c78);
                          local_8d8 = hit.vu.field_0.v[lVar18];
                          iVar39 = hit.vv.field_0.i[lVar18];
                          *(float *)(ray + k * 4 + 0x80) = hit.vt.field_0.v[lVar18];
                          local_b68 = context->user;
                          local_8c8._4_4_ = iVar39;
                          local_8c8._0_4_ = iVar39;
                          local_8c8._8_4_ = iVar39;
                          local_8c8._12_4_ = iVar39;
                          local_908 = *(undefined4 *)((long)&hit.vNg.field_0 + lVar18 * 4);
                          uVar10 = *(undefined4 *)((long)&hit.vNg.field_0 + lVar18 * 4 + 0x10);
                          local_8e8 = *(undefined4 *)((long)&hit.vNg.field_0 + lVar18 * 4 + 0x20);
                          local_8f8._4_4_ = uVar10;
                          local_8f8._0_4_ = uVar10;
                          local_8f8._8_4_ = uVar10;
                          local_8f8._12_4_ = uVar10;
                          uStack_904 = local_908;
                          uStack_900 = local_908;
                          uStack_8fc = local_908;
                          uStack_8e4 = local_8e8;
                          uStack_8e0 = local_8e8;
                          uStack_8dc = local_8e8;
                          fStack_8d4 = local_8d8;
                          fStack_8d0 = local_8d8;
                          fStack_8cc = local_8d8;
                          local_8b8 = CONCAT44(fStack_b84,local_b88);
                          uStack_8b0 = CONCAT44(fStack_b7c,fStack_b80);
                          local_8a8 = CONCAT44(fStack_b74,local_b78);
                          uStack_8a0 = CONCAT44(fStack_b6c,fStack_b70);
                          local_898 = local_b68->instID[0];
                          uStack_894 = local_898;
                          uStack_890 = local_898;
                          uStack_88c = local_898;
                          local_888 = local_b68->instPrimID[0];
                          uStack_884 = local_888;
                          uStack_880 = local_888;
                          uStack_87c = local_888;
                          local_bd8 = local_b98;
                          args.valid = (int *)local_bd8;
                          args.geometryUserPtr = pGVar17->userPtr;
                          args.hit = (RTCHitN *)&local_908;
                          args.N = 4;
                          args.context = local_b68;
                          args.ray = (RTCRayN *)ray;
                          if (pGVar17->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar17->occlusionFilterN)(&args);
                            auVar49 = local_bc8;
                          }
                          if (local_bd8 == (undefined1  [16])0x0) {
                            auVar95._8_4_ = 0xffffffff;
                            auVar95._0_8_ = 0xffffffffffffffff;
                            auVar95._12_4_ = 0xffffffff;
                            auVar95 = auVar95 ^ _DAT_01febe20;
                          }
                          else {
                            p_Var19 = context->args->filter;
                            if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar17->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var19)(&args);
                              auVar49 = local_bc8;
                            }
                            auVar72._0_4_ = -(uint)(local_bd8._0_4_ == 0);
                            auVar72._4_4_ = -(uint)(local_bd8._4_4_ == 0);
                            auVar72._8_4_ = -(uint)(local_bd8._8_4_ == 0);
                            auVar72._12_4_ = -(uint)(local_bd8._12_4_ == 0);
                            auVar95 = auVar72 ^ _DAT_01febe20;
                            auVar62 = blendvps(_DAT_01feba00,*(undefined1 (*) [16])(args.ray + 0x80)
                                               ,auVar72);
                            *(undefined1 (*) [16])(args.ray + 0x80) = auVar62;
                          }
                          if ((_DAT_01fecb20 & auVar95) != (undefined1  [16])0x0) {
                            if (((uint)local_bb8 & 1) == 0) goto LAB_002c20dd;
                            break;
                          }
                          *(float *)(ray + k * 4 + 0x80) = local_ba8;
                          local_c28 = local_c28 ^ 1L << ((ulong)local_c78 & 0x3f);
                          lVar18 = 0;
                          if (local_c28 != 0) {
                            for (; (local_c28 >> lVar18 & 1) == 0; lVar18 = lVar18 + 1) {
                            }
                          }
                          local_c78 = (uint)lVar18;
                          uStack_c74 = (undefined4)((ulong)lVar18 >> 0x20);
                          local_bb8 = (float)CONCAT31(local_bb8._1_3_,local_c28 == 0);
                        } while (local_c28 != 0);
                      }
                    }
                  }
                }
              }
              fVar204 = *(float *)(ray + k * 4);
              fVar123 = *(float *)(ray + k * 4 + 0x10);
              fVar103 = *(float *)(ray + k * 4 + 0x20);
              local_b58 = local_b58 - fVar204;
              fVar175 = local_848 - fVar204;
              fVar178 = (float)local_868 - fVar204;
              fVar181 = local_858 - fVar204;
              fStack_b54 = fStack_b54 - fVar123;
              fVar133 = fStack_844 - fVar123;
              fStack_b60 = local_868._4_4_ - fVar123;
              fStack_b5c = fStack_854 - fVar123;
              fStack_b50 = fStack_b50 - fVar103;
              fVar121 = fStack_840 - fVar103;
              fVar122 = (float)uStack_860 - fVar103;
              fVar61 = fStack_850 - fVar103;
              fVar83 = (float)local_838 - fVar204;
              fVar86 = local_838._4_4_ - fVar204;
              fVar87 = fStack_830 - fVar204;
              fVar104 = fStack_82c - fVar204;
              fVar173 = fVar173 - fVar123;
              fVar177 = fVar177 - fVar123;
              fVar180 = fVar180 - fVar123;
              fVar183 = fVar183 - fVar123;
              fVar136 = fVar136 - fVar103;
              fVar145 = fVar145 - fVar103;
              fVar146 = fVar146 - fVar103;
              fVar147 = fVar147 - fVar103;
              fVar194 = (float)local_818 - fVar204;
              fVar196 = local_818._4_4_ - fVar204;
              fVar197 = fStack_810 - fVar204;
              fVar204 = fStack_80c - fVar204;
              fVar110 = local_828 - fVar123;
              fVar111 = fStack_824 - fVar123;
              fVar112 = fStack_820 - fVar123;
              fVar123 = fStack_81c - fVar123;
              fVar191 = (float)local_808 - fVar103;
              fVar192 = local_808._4_4_ - fVar103;
              fVar193 = fStack_800 - fVar103;
              fVar103 = fStack_7fc - fVar103;
              local_ba8 = fVar194 - local_b58;
              fStack_ba4 = fVar196 - fVar175;
              fStack_ba0 = fVar197 - fVar178;
              fStack_b9c = fVar204 - fVar181;
              local_b78 = fVar110 - fStack_b54;
              fStack_b74 = fVar111 - fVar133;
              fStack_b70 = fVar112 - fStack_b60;
              fStack_b6c = fVar123 - fStack_b5c;
              local_bb8 = fVar191 - fStack_b50;
              fStack_bb4 = fVar192 - fVar121;
              fStack_bb0 = fVar193 - fVar122;
              fStack_bac = fVar103 - fVar61;
              fVar114 = *(float *)(ray + k * 4 + 0x50);
              fVar212 = *(float *)(ray + k * 4 + 0x60);
              fVar115 = *(float *)(ray + k * 4 + 0x40);
              fVar170 = (local_b78 * (fVar191 + fStack_b50) - (fVar110 + fStack_b54) * local_bb8) *
                        fVar115 + ((fVar194 + local_b58) * local_bb8 -
                                  (fVar191 + fStack_b50) * local_ba8) * fVar114 +
                                  (local_ba8 * (fVar110 + fStack_b54) -
                                  (fVar194 + local_b58) * local_b78) * fVar212;
              fVar171 = (fStack_b74 * (fVar192 + fVar121) - (fVar111 + fVar133) * fStack_bb4) *
                        fVar115 + ((fVar196 + fVar175) * fStack_bb4 -
                                  (fVar192 + fVar121) * fStack_ba4) * fVar114 +
                                  (fStack_ba4 * (fVar111 + fVar133) -
                                  (fVar196 + fVar175) * fStack_b74) * fVar212;
              local_bc8 = (undefined1  [8])CONCAT44(fVar171,fVar170);
              fStack_bc0 = (fStack_b70 * (fVar193 + fVar122) - (fVar112 + fStack_b60) * fStack_bb0)
                           * fVar115 +
                           ((fVar197 + fVar178) * fStack_bb0 - (fVar193 + fVar122) * fStack_ba0) *
                           fVar114 + (fStack_ba0 * (fVar112 + fStack_b60) -
                                     (fVar197 + fVar178) * fStack_b70) * fVar212;
              fStack_bbc = (fStack_b6c * (fVar103 + fVar61) - (fVar123 + fStack_b5c) * fStack_bac) *
                           fVar115 + ((fVar204 + fVar181) * fStack_bac -
                                     (fVar103 + fVar61) * fStack_b9c) * fVar114 +
                                     (fStack_b9c * (fVar123 + fStack_b5c) -
                                     (fVar204 + fVar181) * fStack_b6c) * fVar212;
              fVar185 = local_b58 - fVar83;
              fVar186 = fVar175 - fVar86;
              fVar189 = fVar178 - fVar87;
              fVar190 = fVar181 - fVar104;
              fVar158 = fStack_b54 - fVar173;
              fVar163 = fVar133 - fVar177;
              fVar164 = fStack_b60 - fVar180;
              fVar165 = fStack_b5c - fVar183;
              local_b88 = fStack_b50 - fVar136;
              fStack_b84 = fVar121 - fVar145;
              fStack_b80 = fVar122 - fVar146;
              fStack_b7c = fVar61 - fVar147;
              local_b68 = (RTCRayQueryContext *)CONCAT44(fVar133,fStack_b54);
              fVar113 = (fVar158 * (fStack_b50 + fVar136) - (fStack_b54 + fVar173) * local_b88) *
                        fVar115 + ((local_b58 + fVar83) * local_b88 -
                                  (fStack_b50 + fVar136) * fVar185) * fVar114 +
                                  (fVar185 * (fStack_b54 + fVar173) - (local_b58 + fVar83) * fVar158
                                  ) * fVar212;
              fVar134 = (fVar163 * (fVar121 + fVar145) - (fVar133 + fVar177) * fStack_b84) * fVar115
                        + ((fVar175 + fVar86) * fStack_b84 - (fVar121 + fVar145) * fVar186) *
                          fVar114 + (fVar186 * (fVar133 + fVar177) - (fVar175 + fVar86) * fVar163) *
                                    fVar212;
              fVar144 = (fVar164 * (fVar122 + fVar146) - (fStack_b60 + fVar180) * fStack_b80) *
                        fVar115 + ((fVar178 + fVar87) * fStack_b80 - (fVar122 + fVar146) * fVar189)
                                  * fVar114 +
                                  (fVar189 * (fStack_b60 + fVar180) - (fVar178 + fVar87) * fVar164)
                                  * fVar212;
              fVar156 = (fVar165 * (fVar61 + fVar147) - (fStack_b5c + fVar183) * fStack_b7c) *
                        fVar115 + ((fVar181 + fVar104) * fStack_b7c - (fVar61 + fVar147) * fVar190)
                                  * fVar114 +
                                  (fVar190 * (fStack_b5c + fVar183) - (fVar181 + fVar104) * fVar165)
                                  * fVar212;
              fVar172 = fVar83 - fVar194;
              fVar176 = fVar86 - fVar196;
              fVar179 = fVar87 - fVar197;
              fVar182 = fVar104 - fVar204;
              local_b98._4_4_ = fVar134;
              local_b98._0_4_ = fVar113;
              local_b98._8_4_ = fVar144;
              local_b98._12_4_ = fVar156;
              fVar166 = fVar173 - fVar110;
              fVar167 = fVar177 - fVar111;
              fVar168 = fVar180 - fVar112;
              fVar169 = fVar183 - fVar123;
              fVar132 = fVar136 - fVar191;
              fVar135 = fVar145 - fVar192;
              fVar148 = fVar146 - fVar193;
              fVar157 = fVar147 - fVar103;
              auVar73._0_4_ =
                   (fVar166 * (fVar191 + fVar136) - (fVar110 + fVar173) * fVar132) * fVar115 +
                   ((fVar194 + fVar83) * fVar132 - (fVar191 + fVar136) * fVar172) * fVar114 +
                   (fVar172 * (fVar110 + fVar173) - (fVar194 + fVar83) * fVar166) * fVar212;
              auVar73._4_4_ =
                   (fVar167 * (fVar192 + fVar145) - (fVar111 + fVar177) * fVar135) * fVar115 +
                   ((fVar196 + fVar86) * fVar135 - (fVar192 + fVar145) * fVar176) * fVar114 +
                   (fVar176 * (fVar111 + fVar177) - (fVar196 + fVar86) * fVar167) * fVar212;
              auVar73._8_4_ =
                   (fVar168 * (fVar193 + fVar146) - (fVar112 + fVar180) * fVar148) * fVar115 +
                   ((fVar197 + fVar87) * fVar148 - (fVar193 + fVar146) * fVar179) * fVar114 +
                   (fVar179 * (fVar112 + fVar180) - (fVar197 + fVar87) * fVar168) * fVar212;
              auVar73._12_4_ =
                   (fVar169 * (fVar103 + fVar147) - (fVar123 + fVar183) * fVar157) * fVar115 +
                   ((fVar204 + fVar104) * fVar157 - (fVar103 + fVar147) * fVar182) * fVar114 +
                   (fVar182 * (fVar123 + fVar183) - (fVar204 + fVar104) * fVar169) * fVar212;
              hit.UVW.field_0.v[0] = fVar170 + fVar113 + auVar73._0_4_;
              hit.UVW.field_0.v[1] = fVar171 + fVar134 + auVar73._4_4_;
              hit.UVW.field_0.v[2] = fStack_bc0 + fVar144 + auVar73._8_4_;
              hit.UVW.field_0.v[3] = fStack_bbc + fVar156 + auVar73._12_4_;
              auVar96._8_4_ = fStack_bc0;
              auVar96._0_8_ = local_bc8;
              auVar96._12_4_ = fStack_bbc;
              auVar62 = minps(auVar96,local_b98);
              auVar62 = minps(auVar62,auVar73);
              auVar142._8_4_ = fStack_bc0;
              auVar142._0_8_ = local_bc8;
              auVar142._12_4_ = fStack_bbc;
              auVar88 = maxps(auVar142,local_b98);
              auVar88 = maxps(auVar88,auVar73);
              fVar204 = ABS(hit.UVW.field_0.v[0]) * 1.1920929e-07;
              fVar123 = ABS(hit.UVW.field_0.v[1]) * 1.1920929e-07;
              fVar103 = ABS(hit.UVW.field_0.v[2]) * 1.1920929e-07;
              fVar173 = ABS(hit.UVW.field_0.v[3]) * 1.1920929e-07;
              auVar143._4_4_ = -(uint)(auVar88._4_4_ <= fVar123);
              auVar143._0_4_ = -(uint)(auVar88._0_4_ <= fVar204);
              auVar143._8_4_ = -(uint)(auVar88._8_4_ <= fVar103);
              auVar143._12_4_ = -(uint)(auVar88._12_4_ <= fVar173);
              auVar97._4_4_ = -(uint)(-fVar123 <= auVar62._4_4_);
              auVar97._0_4_ = -(uint)(-fVar204 <= auVar62._0_4_);
              auVar97._8_4_ = -(uint)(-fVar103 <= auVar62._8_4_);
              auVar97._12_4_ = -(uint)(-fVar173 <= auVar62._12_4_);
              auVar143 = auVar143 | auVar97;
              iVar39 = movmskps(uVar54,auVar143);
              if (iVar39 != 0) {
                auVar188._0_4_ = local_b78 * local_b88 - fVar158 * local_bb8;
                auVar188._4_4_ = fStack_b74 * fStack_b84 - fVar163 * fStack_bb4;
                auVar188._8_4_ = fStack_b70 * fStack_b80 - fVar164 * fStack_bb0;
                auVar188._12_4_ = fStack_b6c * fStack_b7c - fVar165 * fStack_bac;
                auVar153._0_4_ = fVar158 * fVar132 - fVar166 * local_b88;
                auVar153._4_4_ = fVar163 * fVar135 - fVar167 * fStack_b84;
                auVar153._8_4_ = fVar164 * fVar148 - fVar168 * fStack_b80;
                auVar153._12_4_ = fVar165 * fVar157 - fVar169 * fStack_b7c;
                auVar74._4_4_ = -(uint)(ABS(fVar163 * fStack_bb4) < ABS(fVar167 * fStack_b84));
                auVar74._0_4_ = -(uint)(ABS(fVar158 * local_bb8) < ABS(fVar166 * local_b88));
                auVar74._8_4_ = -(uint)(ABS(fVar164 * fStack_bb0) < ABS(fVar168 * fStack_b80));
                auVar74._12_4_ = -(uint)(ABS(fVar165 * fStack_bac) < ABS(fVar169 * fStack_b7c));
                hit.vNg.field_0.field_0.x.field_0 =
                     (vfloat_impl<4>)blendvps(auVar153,auVar188,auVar74);
                auVar131._0_4_ = local_bb8 * fVar185 - local_ba8 * local_b88;
                auVar131._4_4_ = fStack_bb4 * fVar186 - fStack_ba4 * fStack_b84;
                auVar131._8_4_ = fStack_bb0 * fVar189 - fStack_ba0 * fStack_b80;
                auVar131._12_4_ = fStack_bac * fVar190 - fStack_b9c * fStack_b7c;
                auVar199._0_4_ = fVar172 * local_b88 - fVar185 * fVar132;
                auVar199._4_4_ = fVar176 * fStack_b84 - fVar186 * fVar135;
                auVar199._8_4_ = fVar179 * fStack_b80 - fVar189 * fVar148;
                auVar199._12_4_ = fVar182 * fStack_b7c - fVar190 * fVar157;
                auVar75._4_4_ = -(uint)(ABS(fStack_ba4 * fStack_b84) < ABS(fVar186 * fVar135));
                auVar75._0_4_ = -(uint)(ABS(local_ba8 * local_b88) < ABS(fVar185 * fVar132));
                auVar75._8_4_ = -(uint)(ABS(fStack_ba0 * fStack_b80) < ABS(fVar189 * fVar148));
                auVar75._12_4_ = -(uint)(ABS(fStack_b9c * fStack_b7c) < ABS(fVar190 * fVar157));
                hit.vNg.field_0.field_0.y.field_0 =
                     (vfloat_impl<4>)blendvps(auVar199,auVar131,auVar75);
                auVar161._0_4_ = local_ba8 * fVar158 - fVar185 * local_b78;
                auVar161._4_4_ = fStack_ba4 * fVar163 - fVar186 * fStack_b74;
                auVar161._8_4_ = fStack_ba0 * fVar164 - fVar189 * fStack_b70;
                auVar161._12_4_ = fStack_b9c * fVar165 - fVar190 * fStack_b6c;
                auVar206._0_4_ = fVar185 * fVar166 - fVar172 * fVar158;
                auVar206._4_4_ = fVar186 * fVar167 - fVar176 * fVar163;
                auVar206._8_4_ = fVar189 * fVar168 - fVar179 * fVar164;
                auVar206._12_4_ = fVar190 * fVar169 - fVar182 * fVar165;
                auVar76._4_4_ = -(uint)(ABS(fVar186 * fStack_b74) < ABS(fVar176 * fVar163));
                auVar76._0_4_ = -(uint)(ABS(fVar185 * local_b78) < ABS(fVar172 * fVar158));
                auVar76._8_4_ = -(uint)(ABS(fVar189 * fStack_b70) < ABS(fVar179 * fVar164));
                auVar76._12_4_ = -(uint)(ABS(fVar190 * fStack_b6c) < ABS(fVar182 * fVar165));
                hit.vNg.field_0.field_0.z.field_0 =
                     (vfloat_impl<4>)blendvps(auVar206,auVar161,auVar76);
                fVar183 = fVar115 * hit.vNg.field_0._0_4_ +
                          fVar114 * hit.vNg.field_0._16_4_ + fVar212 * hit.vNg.field_0._32_4_;
                fVar147 = fVar115 * hit.vNg.field_0._4_4_ +
                          fVar114 * hit.vNg.field_0._20_4_ + fVar212 * hit.vNg.field_0._36_4_;
                fVar180 = fVar115 * hit.vNg.field_0._8_4_ +
                          fVar114 * hit.vNg.field_0._24_4_ + fVar212 * hit.vNg.field_0._40_4_;
                fVar212 = fVar115 * hit.vNg.field_0._12_4_ +
                          fVar114 * hit.vNg.field_0._28_4_ + fVar212 * hit.vNg.field_0._44_4_;
                fVar183 = fVar183 + fVar183;
                fVar147 = fVar147 + fVar147;
                fVar180 = fVar180 + fVar180;
                fVar212 = fVar212 + fVar212;
                auVar98._0_4_ =
                     fStack_b54 * hit.vNg.field_0._16_4_ + fStack_b50 * hit.vNg.field_0._32_4_;
                auVar98._4_4_ = fVar133 * hit.vNg.field_0._20_4_ + fVar121 * hit.vNg.field_0._36_4_;
                auVar98._8_4_ =
                     fStack_b60 * hit.vNg.field_0._24_4_ + fVar122 * hit.vNg.field_0._40_4_;
                auVar98._12_4_ =
                     fStack_b5c * hit.vNg.field_0._28_4_ + fVar61 * hit.vNg.field_0._44_4_;
                fVar136 = local_b58 * hit.vNg.field_0._0_4_ + auVar98._0_4_;
                fVar177 = fVar175 * hit.vNg.field_0._4_4_ + auVar98._4_4_;
                fVar145 = fVar178 * hit.vNg.field_0._8_4_ + auVar98._8_4_;
                fVar114 = fVar181 * hit.vNg.field_0._12_4_ + auVar98._12_4_;
                auVar32._4_4_ = fVar147;
                auVar32._0_4_ = fVar183;
                auVar32._8_4_ = fVar180;
                auVar32._12_4_ = fVar212;
                auVar62 = rcpps(auVar98,auVar32);
                fVar204 = auVar62._0_4_;
                fVar123 = auVar62._4_4_;
                fVar103 = auVar62._8_4_;
                fVar173 = auVar62._12_4_;
                hit.vt.field_0.v[0] =
                     ((1.0 - fVar183 * fVar204) * fVar204 + fVar204) * (fVar136 + fVar136);
                hit.vt.field_0.v[1] =
                     ((1.0 - fVar147 * fVar123) * fVar123 + fVar123) * (fVar177 + fVar177);
                hit.vt.field_0.v[2] =
                     ((1.0 - fVar180 * fVar103) * fVar103 + fVar103) * (fVar145 + fVar145);
                hit.vt.field_0.v[3] =
                     ((1.0 - fVar212 * fVar173) * fVar173 + fVar173) * (fVar114 + fVar114);
                fVar204 = *(float *)(ray + k * 4 + 0x80);
                fVar123 = *(float *)(ray + k * 4 + 0x30);
                auVar99._0_4_ =
                     -(uint)(hit.vt.field_0.v[0] <= fVar204 && fVar123 <= hit.vt.field_0.v[0]) &
                     auVar143._0_4_;
                auVar99._4_4_ =
                     -(uint)(hit.vt.field_0.v[1] <= fVar204 && fVar123 <= hit.vt.field_0.v[1]) &
                     auVar143._4_4_;
                auVar99._8_4_ =
                     -(uint)(hit.vt.field_0.v[2] <= fVar204 && fVar123 <= hit.vt.field_0.v[2]) &
                     auVar143._8_4_;
                auVar99._12_4_ =
                     -(uint)(hit.vt.field_0.v[3] <= fVar204 && fVar123 <= hit.vt.field_0.v[3]) &
                     auVar143._12_4_;
                iVar39 = movmskps(uVar54,auVar99);
                if (iVar39 != 0) {
                  hit.valid.field_0._0_4_ = auVar99._0_4_ & -(uint)(fVar183 != 0.0);
                  hit.valid.field_0._4_4_ = auVar99._4_4_ & -(uint)(fVar147 != 0.0);
                  hit.valid.field_0._8_4_ = auVar99._8_4_ & -(uint)(fVar180 != 0.0);
                  hit.valid.field_0._12_4_ = auVar99._12_4_ & -(uint)(fVar212 != 0.0);
                  iVar39 = movmskps(iVar39,(undefined1  [16])hit.valid.field_0);
                  if (iVar39 != 0) {
                    hit.mapUV = &mapUV;
                    auVar109._0_4_ = hit.UVW.field_0.v[0] - fVar113;
                    auVar109._4_4_ = hit.UVW.field_0.v[1] - fVar134;
                    auVar109._8_4_ = hit.UVW.field_0.v[2] - fVar144;
                    auVar109._12_4_ = hit.UVW.field_0.v[3] - fVar156;
                    auVar100._4_12_ = hit.valid.field_0._4_12_;
                    auVar100._0_4_ = (float)(int)(*(ushort *)(lVar40 + 8 + (long)auVar49) - 1);
                    auVar154._4_4_ = hit.valid.field_0._4_4_;
                    auVar154._0_4_ = auVar100._0_4_;
                    auVar154._8_4_ = hit.valid.field_0._8_4_;
                    auVar154._12_4_ = hit.valid.field_0._12_4_;
                    auVar62 = rcpss(auVar154,auVar100);
                    fVar204 = (2.0 - auVar100._0_4_ * auVar62._0_4_) * auVar62._0_4_;
                    auVar155._4_12_ = auVar62._4_12_;
                    auVar155._0_4_ = (float)(int)(*(ushort *)(lVar40 + 10 + (long)auVar49) - 1);
                    auVar162._4_4_ = auVar62._4_4_;
                    auVar162._0_4_ = auVar155._0_4_;
                    auVar162._8_4_ = auVar62._8_4_;
                    auVar162._12_4_ = auVar62._12_4_;
                    auVar62 = rcpss(auVar162,auVar155);
                    fVar123 = (2.0 - auVar155._0_4_ * auVar62._0_4_) * auVar62._0_4_;
                    hit.U.field_0._0_4_ =
                         fVar204 * ((float)uVar43 * hit.UVW.field_0.v[0] +
                                   (hit.UVW.field_0.v[0] - fVar170));
                    hit.U.field_0._4_4_ =
                         fVar204 * ((float)(uVar43 + 1) * hit.UVW.field_0.v[1] +
                                   (hit.UVW.field_0.v[1] - fVar171));
                    hit.U.field_0._8_4_ =
                         fVar204 * ((float)(uVar43 + 1) * hit.UVW.field_0.v[2] +
                                   (hit.UVW.field_0.v[2] - fStack_bc0));
                    hit.U.field_0._12_4_ =
                         fVar204 * ((float)uVar43 * hit.UVW.field_0.v[3] +
                                   (hit.UVW.field_0.v[3] - fStack_bbc));
                    hit.V.field_0._0_4_ =
                         fVar123 * ((float)uVar44 * hit.UVW.field_0.v[0] + auVar109._0_4_);
                    hit.V.field_0._4_4_ =
                         fVar123 * ((float)uVar44 * hit.UVW.field_0.v[1] + auVar109._4_4_);
                    hit.V.field_0._8_4_ =
                         fVar123 * ((float)(uVar44 + 1) * hit.UVW.field_0.v[2] + auVar109._8_4_);
                    hit.V.field_0._12_4_ =
                         fVar123 * ((float)(uVar44 + 1) * hit.UVW.field_0.v[3] + auVar109._12_4_);
                    pGVar17 = (context->scene->geometries).items[uVar38].ptr;
                    if ((pGVar17->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar17->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_002c20dd;
                      auVar62 = rcpps(auVar109,(undefined1  [16])hit.UVW.field_0);
                      fVar204 = auVar62._0_4_;
                      fVar123 = auVar62._4_4_;
                      fVar103 = auVar62._8_4_;
                      fVar173 = auVar62._12_4_;
                      fVar204 = (float)(-(uint)(1e-18 <= ABS(hit.UVW.field_0.v[0])) &
                                       (uint)(((float)DAT_01feca10 - hit.UVW.field_0.v[0] * fVar204)
                                              * fVar204 + fVar204));
                      fVar123 = (float)(-(uint)(1e-18 <= ABS(hit.UVW.field_0.v[1])) &
                                       (uint)((DAT_01feca10._4_4_ - hit.UVW.field_0.v[1] * fVar123)
                                              * fVar123 + fVar123));
                      fVar103 = (float)(-(uint)(1e-18 <= ABS(hit.UVW.field_0.v[2])) &
                                       (uint)((DAT_01feca10._8_4_ - hit.UVW.field_0.v[2] * fVar103)
                                              * fVar103 + fVar103));
                      fVar173 = (float)(-(uint)(1e-18 <= ABS(hit.UVW.field_0.v[3])) &
                                       (uint)((DAT_01feca10._12_4_ - hit.UVW.field_0.v[3] * fVar173)
                                              * fVar173 + fVar173));
                      auVar77._0_4_ = hit.U.field_0._0_4_ * fVar204;
                      auVar77._4_4_ = hit.U.field_0._4_4_ * fVar123;
                      auVar77._8_4_ = hit.U.field_0._8_4_ * fVar103;
                      auVar77._12_4_ = hit.U.field_0._12_4_ * fVar173;
                      hit.vu.field_0 =
                           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           minps(auVar77,_DAT_01feca10);
                      auVar101._0_4_ = hit.V.field_0._0_4_ * fVar204;
                      auVar101._4_4_ = hit.V.field_0._4_4_ * fVar123;
                      auVar101._8_4_ = hit.V.field_0._8_4_ * fVar103;
                      auVar101._12_4_ = hit.V.field_0._12_4_ * fVar173;
                      hit.vv.field_0 =
                           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           minps(auVar101,_DAT_01feca10);
                      iVar39 = movmskps(SUB84(auVar49,0),(undefined1  [16])hit.valid.field_0);
                      uVar50 = CONCAT44((int)((ulong)auVar49 >> 0x20),iVar39);
                      uVar41 = 0;
                      if (uVar50 != 0) {
                        for (; (uVar50 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                        }
                      }
                      bVar59 = iVar39 == 0;
                      if (!bVar59) {
                        auVar36 = *(undefined1 (*) [12])*local_b40;
                        uStack_c6c = (undefined4)((ulong)*(undefined8 *)(*local_b40 + 8) >> 0x20);
                        local_b58 = (float)uVar15;
                        fStack_b54 = (float)uVar15;
                        fStack_b50 = (float)uVar15;
                        fStack_b4c = (float)uVar15;
                        do {
                          uVar54 = *(undefined4 *)(ray + k * 4 + 0x80);
                          local_8d8 = hit.vu.field_0.v[uVar41];
                          iVar39 = hit.vv.field_0.i[uVar41];
                          *(float *)(ray + k * 4 + 0x80) = hit.vt.field_0.v[uVar41];
                          args.context = context->user;
                          local_8c8._4_4_ = iVar39;
                          local_8c8._0_4_ = iVar39;
                          local_8c8._8_4_ = iVar39;
                          local_8c8._12_4_ = iVar39;
                          local_908 = *(undefined4 *)((long)&hit.vNg.field_0 + uVar41 * 4);
                          uVar10 = *(undefined4 *)((long)&hit.vNg.field_0 + uVar41 * 4 + 0x10);
                          local_8e8 = *(undefined4 *)((long)&hit.vNg.field_0 + uVar41 * 4 + 0x20);
                          local_8f8._4_4_ = uVar10;
                          local_8f8._0_4_ = uVar10;
                          local_8f8._8_4_ = uVar10;
                          local_8f8._12_4_ = uVar10;
                          uStack_904 = local_908;
                          uStack_900 = local_908;
                          uStack_8fc = local_908;
                          uStack_8e4 = local_8e8;
                          uStack_8e0 = local_8e8;
                          uStack_8dc = local_8e8;
                          fStack_8d4 = local_8d8;
                          fStack_8d0 = local_8d8;
                          fStack_8cc = local_8d8;
                          local_8b8 = CONCAT44(fStack_b54,local_b58);
                          uStack_8b0 = CONCAT44(fStack_b4c,fStack_b50);
                          local_8a8 = CONCAT44(uVar38,uVar38);
                          uStack_8a0 = CONCAT44(uVar38,uVar38);
                          local_898 = (args.context)->instID[0];
                          uStack_894 = local_898;
                          uStack_890 = local_898;
                          uStack_88c = local_898;
                          local_888 = (args.context)->instPrimID[0];
                          uStack_884 = local_888;
                          uStack_880 = local_888;
                          uStack_87c = local_888;
                          local_bd8._12_4_ = uStack_c6c;
                          local_bd8._0_12_ = auVar36;
                          args.valid = (int *)local_bd8;
                          args.geometryUserPtr = pGVar17->userPtr;
                          args.hit = (RTCHitN *)&local_908;
                          args.N = 4;
                          args.ray = (RTCRayN *)ray;
                          if (pGVar17->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar17->occlusionFilterN)(&args);
                          }
                          if (local_bd8 == (undefined1  [16])0x0) {
                            auVar102._8_4_ = 0xffffffff;
                            auVar102._0_8_ = 0xffffffffffffffff;
                            auVar102._12_4_ = 0xffffffff;
                            auVar102 = auVar102 ^ _DAT_01febe20;
                          }
                          else {
                            p_Var19 = context->args->filter;
                            if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar17->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var19)(&args);
                            }
                            auVar78._0_4_ = -(uint)(local_bd8._0_4_ == 0);
                            auVar78._4_4_ = -(uint)(local_bd8._4_4_ == 0);
                            auVar78._8_4_ = -(uint)(local_bd8._8_4_ == 0);
                            auVar78._12_4_ = -(uint)(local_bd8._12_4_ == 0);
                            auVar102 = auVar78 ^ _DAT_01febe20;
                            auVar62 = blendvps(_DAT_01feba00,*(undefined1 (*) [16])(args.ray + 0x80)
                                               ,auVar78);
                            *(undefined1 (*) [16])(args.ray + 0x80) = auVar62;
                          }
                          if ((_DAT_01fecb20 & auVar102) != (undefined1  [16])0x0) {
                            if (!bVar59) goto LAB_002c20dd;
                            break;
                          }
                          *(undefined4 *)(ray + k * 4 + 0x80) = uVar54;
                          uVar50 = uVar50 ^ 1L << (uVar41 & 0x3f);
                          uVar41 = 0;
                          if (uVar50 != 0) {
                            for (; (uVar50 >> uVar41 & 1) == 0; uVar41 = uVar41 + 1) {
                            }
                          }
                          bVar59 = uVar50 == 0;
                        } while (!bVar59);
                      }
                    }
                  }
                }
              }
              uVar42 = uVar42 & uVar42 - 1;
            } while (uVar42 != 0);
          }
          uVar46 = uVar46 + 1;
          bVar58 = uVar46 < uVar48;
        } while (uVar46 != uVar48);
      }
LAB_002c20dd:
      uVar38 = 0;
      if (bVar58) {
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        uVar38 = 1;
      }
    }
  } while ((uVar38 & 3) == 0);
  return pNVar37 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }